

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void convolve_8tap_unpack_avx2(__m256i *s,__m256i *ss)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  
  auVar1 = vpunpcklwd_avx2(*in_RDI,in_RDI[1]);
  *in_RSI = auVar1;
  auVar1 = vpunpcklwd_avx2(in_RDI[2],in_RDI[3]);
  in_RSI[1] = auVar1;
  auVar1 = vpunpcklwd_avx2(in_RDI[4],in_RDI[5]);
  in_RSI[2] = auVar1;
  auVar1 = vpunpckhwd_avx2(*in_RDI,in_RDI[1]);
  in_RSI[4] = auVar1;
  auVar1 = vpunpckhwd_avx2(in_RDI[2],in_RDI[3]);
  in_RSI[5] = auVar1;
  auVar1 = vpunpckhwd_avx2(in_RDI[4],in_RDI[5]);
  in_RSI[6] = auVar1;
  return;
}

Assistant:

static inline void convolve_8tap_unpack_avx2(const __m256i s[6],
                                             __m256i ss[7]) {
  ss[0] = _mm256_unpacklo_epi16(s[0], s[1]);
  ss[1] = _mm256_unpacklo_epi16(s[2], s[3]);
  ss[2] = _mm256_unpacklo_epi16(s[4], s[5]);
  ss[4] = _mm256_unpackhi_epi16(s[0], s[1]);
  ss[5] = _mm256_unpackhi_epi16(s[2], s[3]);
  ss[6] = _mm256_unpackhi_epi16(s[4], s[5]);
}